

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

uint __thiscall
Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial
          (FBXConverter *this,MeshGeometry *mesh,Model *model,aiMatrix4x4 *node_global_transform,
          aiNode *nd)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  pointer paVar11;
  pointer puVar12;
  pointer puVar13;
  uint *puVar14;
  pointer paVar15;
  pointer paVar16;
  value_type_conflict4 *pvVar17;
  pointer ppSVar18;
  ShapeGeometry *this_00;
  pointer ppaVar19;
  pointer ppaVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  aiAnimMesh *paVar26;
  undefined8 uVar27;
  uint uVar28;
  aiVector2D *v;
  string *__return_storage_ptr__;
  aiMesh *out;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar29;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar30;
  aiVector3D *paVar31;
  ulong *puVar32;
  aiFace *paVar33;
  uint *puVar34;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar35;
  MeshGeometry *this_01;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar36;
  pointer paVar37;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pvVar38;
  aiColor4D *__s;
  Skin *pSVar39;
  vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_> *pvVar40
  ;
  pointer ppBVar41;
  pointer ppBVar42;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar43;
  uint *puVar44;
  aiAnimMesh **ppaVar45;
  pointer paVar46;
  ulong uVar47;
  pointer paVar48;
  size_t sVar49;
  uint i;
  pointer piVar50;
  iterator iVar51;
  int iVar52;
  long lVar53;
  size_t __n;
  aiFace *f;
  aiFace *paVar54;
  long lVar55;
  ulong uVar56;
  float fVar57;
  float fVar58;
  aiAnimMesh *animMesh;
  vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> animMeshes;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempBinormals;
  aiAnimMesh *local_e0;
  BlendShapeChannel *local_d8;
  Model *local_d0;
  void *local_c8;
  iterator iStack_c0;
  aiAnimMesh **local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [32];
  float local_78 [4];
  undefined8 local_68;
  Skin *pSStack_60;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  local_d0 = model;
  local_78._0_8_ = node_global_transform;
  __return_storage_ptr__ = (string *)MeshGeometry::GetMaterialIndices(mesh);
  local_78._8_8_ = this;
  out = SetupEmptyMesh(this,&mesh->super_Geometry,nd);
  pvVar29 = MeshGeometry::GetVertices(mesh);
  pvVar30 = MeshGeometry::GetFaceIndexCounts(mesh);
  out->mNumVertices =
       (int)((ulong)((long)(pvVar29->
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar29->
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  paVar46 = (pvVar29->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  paVar11 = (pvVar29->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = ((long)paVar11 - (long)paVar46 >> 2) * -0x5555555555555555;
  uVar56 = 0xffffffffffffffff;
  if (SUB168(auVar21 * ZEXT816(0xc),8) == 0) {
    uVar56 = SUB168(auVar21 * ZEXT816(0xc),0);
  }
  local_a8 = pvVar29;
  paVar31 = (aiVector3D *)operator_new__(uVar56);
  lVar55 = (long)paVar11 - (long)paVar46;
  if (lVar55 != 0) {
    memset(paVar31,0,((lVar55 - 0xcU) / 0xc) * 0xc + 0xc);
  }
  out->mVertices = paVar31;
  paVar46 = (local_a8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  sVar49 = (long)(local_a8->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_finish - (long)paVar46;
  if (sVar49 != 0) {
    memmove(paVar31,paVar46,sVar49);
  }
  out->mNumFaces =
       (uint)((ulong)((long)(pvVar30->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)(pvVar30->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 2);
  puVar12 = (pvVar30->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  puVar13 = (pvVar30->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar55 = (long)puVar12 - (long)puVar13;
  uVar56 = lVar55 >> 2;
  puVar32 = (ulong *)operator_new__(-(ulong)(uVar56 >> 0x3c != 0) | lVar55 * 4 + 8U);
  paVar54 = (aiFace *)(puVar32 + 1);
  *puVar32 = uVar56;
  if (puVar12 != puVar13) {
    paVar33 = paVar54;
    do {
      paVar33->mNumIndices = 0;
      paVar33->mIndices = (uint *)0x0;
      paVar33 = paVar33 + 1;
    } while (paVar33 != paVar54 + uVar56);
  }
  out->mFaces = paVar54;
  puVar44 = (pvVar30->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar14 = (pvVar30->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (puVar44 != puVar14) {
    iVar52 = 0;
    do {
      uVar28 = *puVar44;
      uVar56 = (ulong)uVar28;
      paVar54->mNumIndices = uVar28;
      puVar34 = (uint *)operator_new__(uVar56 * 4);
      paVar54->mIndices = puVar34;
      if (uVar28 - 1 < 3) {
        out->mPrimitiveTypes =
             out->mPrimitiveTypes | *(uint *)(&DAT_006c3050 + (ulong)(uVar28 - 1) * 4);
LAB_005b21cd:
        uVar47 = 0;
        do {
          paVar54->mIndices[uVar47] = iVar52 + (int)uVar47;
          uVar47 = uVar47 + 1;
        } while (uVar56 != uVar47);
        iVar52 = iVar52 + (int)uVar47;
      }
      else {
        out->mPrimitiveTypes = out->mPrimitiveTypes | 8;
        if (uVar56 != 0) goto LAB_005b21cd;
      }
      paVar54 = paVar54 + 1;
      puVar44 = puVar44 + 1;
    } while (puVar44 != puVar14);
  }
  pvVar29 = MeshGeometry::GetNormals(mesh);
  lVar55 = (long)(pvVar29->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar29->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar55 != 0) {
    paVar46 = (local_a8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    paVar11 = (local_a8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
              ._M_impl.super__Vector_impl_data._M_finish;
    if (lVar55 != (long)paVar11 - (long)paVar46) goto LAB_005b2c07;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = (lVar55 >> 2) * -0x5555555555555555;
    uVar56 = 0xffffffffffffffff;
    if (SUB168(auVar22 * ZEXT816(0xc),8) == 0) {
      uVar56 = SUB168(auVar22 * ZEXT816(0xc),0);
    }
    paVar31 = (aiVector3D *)operator_new__(uVar56);
    lVar55 = (long)paVar11 - (long)paVar46;
    if (lVar55 != 0) {
      memset(paVar31,0,((lVar55 - 0xcU) / 0xc) * 0xc + 0xc);
    }
    out->mNormals = paVar31;
    paVar46 = (pvVar29->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    sVar49 = (long)(pvVar29->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)paVar46;
    if (sVar49 != 0) {
      memmove(paVar31,paVar46,sVar49);
    }
  }
  pvVar35 = MeshGeometry::GetTangents(mesh);
  this_01 = (MeshGeometry *)MeshGeometry::GetBinormals(mesh);
  if ((pvVar35->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (pvVar35->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
      super__Vector_impl_data._M_start) goto LAB_005b2515;
  local_98._0_8_ = (_func_int **)0x0;
  local_98._8_8_ = (Element *)0x0;
  local_98._16_8_ = (pointer)0x0;
  if ((this_01->super_Geometry).super_Object.element ==
      (Element *)
      ((_Vector_impl_data *)&(this_01->super_Geometry).super_Object._vptr_Object)->_M_start) {
    lVar55 = (long)(pvVar29->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar29->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
    if (lVar55 == 0) goto LAB_005b24fe;
    this_01 = (MeshGeometry *)local_98;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_01,
               (lVar55 >> 2) * -0x5555555555555555);
    paVar11 = (pvVar35->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    paVar46 = (pvVar35->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    paVar48 = paVar46;
    if (paVar46 != paVar11) {
      uVar28 = 1;
      uVar56 = 0;
      paVar46 = paVar11;
      do {
        paVar11 = (pvVar29->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        fVar57 = paVar46[uVar56].x;
        fVar58 = paVar11[uVar56].x;
        paVar11 = paVar11 + uVar56;
        uVar1 = paVar11->y;
        uVar6 = paVar11->z;
        uVar2 = paVar46[uVar56].y;
        uVar7 = paVar46[uVar56].z;
        *(ulong *)(local_98._0_8_ + uVar56 * 0xc) =
             CONCAT44(fVar57 * (float)uVar6 - fVar58 * (float)uVar7,
                      (float)uVar7 * (float)uVar1 - (float)uVar6 * (float)uVar2);
        *(float *)(local_98._0_8_ + uVar56 * 0xc + 8) =
             fVar58 * (float)uVar2 - fVar57 * (float)uVar1;
        uVar56 = (ulong)uVar28;
        paVar46 = (pvVar35->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        paVar48 = (pvVar35->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        uVar47 = ((long)paVar48 - (long)paVar46 >> 2) * -0x5555555555555555;
        uVar28 = uVar28 + 1;
      } while (uVar56 <= uVar47 && uVar47 - uVar56 != 0);
    }
  }
  else {
    paVar46 = (pvVar35->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    paVar48 = (pvVar35->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  }
LAB_005b22eb:
  paVar11 = (local_a8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  paVar15 = (local_a8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  lVar55 = (long)paVar15 - (long)paVar11;
  if ((long)paVar48 - (long)paVar46 != lVar55) {
    __assert_fail("tangents.size() == vertices.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                  ,0x461,
                  "unsigned int Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode &)"
                 );
  }
  if ((long)(this_01->super_Geometry).super_Object.element -
      (long)((_Vector_impl_data *)&(this_01->super_Geometry).super_Object._vptr_Object)->_M_start !=
      (long)paVar48 - (long)paVar46) {
    __assert_fail("binormals->size() == vertices.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                  ,0x462,
                  "unsigned int Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode &)"
                 );
  }
  auVar23._8_8_ = 0;
  auVar23._0_8_ = (lVar55 >> 2) * -0x5555555555555555;
  uVar56 = 0xffffffffffffffff;
  if (SUB168(auVar23 * ZEXT816(0xc),8) == 0) {
    uVar56 = SUB168(auVar23 * ZEXT816(0xc),0);
  }
  paVar31 = (aiVector3D *)operator_new__(uVar56);
  lVar55 = (long)paVar15 - (long)paVar11;
  if (lVar55 != 0) {
    memset(paVar31,0,((lVar55 - 0xcU) / 0xc) * 0xc + 0xc);
  }
  out->mTangents = paVar31;
  paVar46 = (pvVar35->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  sVar49 = (long)(pvVar35->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_finish - (long)paVar46;
  if (sVar49 != 0) {
    memmove(paVar31,paVar46,sVar49);
  }
  paVar46 = (local_a8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  paVar11 = (local_a8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = ((long)paVar11 - (long)paVar46 >> 2) * -0x5555555555555555;
  uVar56 = 0xffffffffffffffff;
  if (SUB168(auVar24 * ZEXT816(0xc),8) == 0) {
    uVar56 = SUB168(auVar24 * ZEXT816(0xc),0);
  }
  paVar31 = (aiVector3D *)operator_new__(uVar56);
  lVar55 = (long)paVar11 - (long)paVar46;
  if (lVar55 != 0) {
    memset(paVar31,0,((lVar55 - 0xcU) / 0xc) * 0xc + 0xc);
  }
  out->mBitangents = paVar31;
  paVar46 = ((_Vector_impl_data *)&(this_01->super_Geometry).super_Object._vptr_Object)->_M_start;
  sVar49 = (long)(this_01->super_Geometry).super_Object.element - (long)paVar46;
  if (sVar49 != 0) {
    memmove(paVar31,paVar46,sVar49);
  }
LAB_005b24fe:
  if ((_func_int **)local_98._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ - local_98._0_8_);
  }
LAB_005b2515:
  lVar55 = 0;
  local_68 = __return_storage_ptr__;
  do {
    pvVar36 = MeshGeometry::GetTextureCoords(mesh,(uint)lVar55);
    if ((pvVar36->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_start ==
        (pvVar36->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_finish) break;
    paVar46 = (local_a8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    paVar11 = (local_a8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
              ._M_impl.super__Vector_impl_data._M_finish;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = ((long)paVar11 - (long)paVar46 >> 2) * -0x5555555555555555;
    uVar56 = SUB168(auVar25 * ZEXT816(0xc),0);
    if (SUB168(auVar25 * ZEXT816(0xc),8) != 0) {
      uVar56 = 0xffffffffffffffff;
    }
    paVar31 = (aiVector3D *)operator_new__(uVar56);
    lVar53 = (long)paVar11 - (long)paVar46;
    if (lVar53 != 0) {
      memset(paVar31,0,((lVar53 - 0xcU) / 0xc) * 0xc + 0xc);
    }
    out->mTextureCoords[lVar55] = paVar31;
    paVar16 = (pvVar36->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    for (paVar37 = (pvVar36->
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start; paVar37 != paVar16;
        paVar37 = paVar37 + 1) {
      fVar57 = paVar37->y;
      paVar31->x = paVar37->x;
      paVar31->y = fVar57;
      paVar31->z = 0.0;
      paVar31 = paVar31 + 1;
    }
    out->mNumUVComponents[lVar55] = 2;
    lVar55 = lVar55 + 1;
  } while (lVar55 != 8);
  uVar56 = 0;
  do {
    iVar51._M_current = (aiAnimMesh **)(uVar56 & 0xffffffff);
    pvVar38 = MeshGeometry::GetVertexColors(mesh,(uint)uVar56);
    if ((pvVar38->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (pvVar38->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl.
        super__Vector_impl_data._M_finish) break;
    paVar46 = (local_a8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
              ._M_impl.super__Vector_impl_data._M_finish;
    paVar11 = (local_a8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    lVar55 = (long)paVar46 - (long)paVar11 >> 2;
    __n = lVar55 * -0x5555555555555550;
    sVar49 = __n;
    if (0xfffffffffffffff < (ulong)(lVar55 * -0x5555555555555555)) {
      sVar49 = 0xffffffffffffffff;
    }
    __s = (aiColor4D *)operator_new__(sVar49);
    if (paVar46 != paVar11) {
      memset(__s,0,__n);
    }
    out->mColors[uVar56] = __s;
    iVar51._M_current =
         (aiAnimMesh **)
         (pvVar38->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
         .super__Vector_impl_data._M_start;
    sVar49 = (long)(pvVar38->
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)iVar51._M_current;
    if (sVar49 != 0) {
      memmove(__s,iVar51._M_current,sVar49);
    }
    uVar56 = uVar56 + 1;
  } while (uVar56 != 8);
  uVar27 = local_78._8_8_;
  if (((*(Document **)(local_78._8_8_ + 0x1a0))->settings->readMaterials == true) &&
     (pvVar17 = (value_type_conflict4 *)(local_68->_M_dataplus)._M_p,
     pvVar17 != (value_type_conflict4 *)local_68->_M_string_length)) {
    iVar51._M_current = (aiAnimMesh **)out;
    ConvertMaterialForMesh((FBXConverter *)local_78._8_8_,out,local_d0,mesh,*pvVar17);
  }
  else {
    LogFunctions<Assimp::FBXImporter>::LogError((char *)0x5b26f1);
    uVar28 = GetDefaultMaterial((FBXConverter *)uVar27);
    out->mMaterialIndex = uVar28;
  }
  if (((*(Document **)(uVar27 + 0x1a0))->settings->readWeights == true) &&
     (pSVar39 = Geometry::DeformerSkin(&mesh->super_Geometry), pSVar39 != (Skin *)0x0)) {
    iVar51._M_current = (aiAnimMesh **)out;
    ConvertWeights((FBXConverter *)uVar27,out,local_d0,mesh,(aiMatrix4x4 *)local_78._0_8_,0xffffffff
                   ,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  }
  local_c8 = (void *)0x0;
  iStack_c0._M_current = (aiAnimMesh **)0x0;
  local_b8 = (aiAnimMesh **)0x0;
  pvVar40 = Geometry::GetBlendShapes(&mesh->super_Geometry);
  ppBVar41 = (pvVar40->
             super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (pvVar40->
             super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar41 != local_58) {
    __return_storage_ptr__ = (string *)local_98;
    do {
      ppBVar42 = ((*ppBVar41)->blendShapeChannels).
                 super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_48 = ((*ppBVar41)->blendShapeChannels).
                 super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_50 = ppBVar41;
      if (ppBVar42 != local_48) {
        do {
          local_d8 = *ppBVar42;
          local_40 = ppBVar42;
          if ((local_d8->shapeGeometries).
              super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (local_d8->shapeGeometries).
              super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            piVar50 = (pointer)0x0;
            do {
              local_e0 = aiCreateAnimMesh(out);
              ppSVar18 = (local_d8->shapeGeometries).
                         super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              if ((pointer)((long)(local_d8->shapeGeometries).
                                  super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar18 >> 3)
                  <= piVar50) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,piVar50);
                goto LAB_005b2bf9;
              }
              this_00 = ppSVar18[(long)piVar50];
              pvVar29 = ShapeGeometry::GetVertices(this_00);
              pvVar43 = ShapeGeometry::GetNormals(this_00);
              pvVar35 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        ShapeGeometry::GetIndices(this_00);
              paVar26 = local_e0;
              local_38 = piVar50;
              FixAnimMeshName(__return_storage_ptr__,(FBXConverter *)iVar51._M_current,
                              &(this_00->super_Geometry).super_Object.name);
              uVar27 = local_98._8_8_;
              if ((ulong)local_98._8_8_ < (Element *)0x400) {
                (paVar26->mName).length = (ai_uint32)local_98._8_8_;
                memcpy((paVar26->mName).data,(void *)local_98._0_8_,local_98._8_8_);
                (paVar26->mName).data[uVar27] = '\0';
              }
              if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
                operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
              }
              paVar46 = (pvVar35->
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              if ((pvVar35->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish != paVar46) {
                uVar56 = 0;
                do {
                  paVar11 = (pvVar29->
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  uVar47 = ((long)(pvVar29->
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)paVar11 >> 2)
                           * -0x5555555555555555;
                  if (uVar47 < uVar56 || uVar47 - uVar56 == 0) {
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar56);
LAB_005b2bcf:
                    paVar46 = (pointer)std::__throw_out_of_range_fmt
                                                 ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                                  ,uVar56);
                    paVar48 = paVar46;
                    this_01 = mesh;
                    goto LAB_005b22eb;
                  }
                  paVar48 = (pvVar43->
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  uVar47 = ((long)(pvVar43->
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)paVar48 >> 2)
                           * -0x5555555555555555;
                  if (uVar47 < uVar56 || uVar47 - uVar56 == 0) goto LAB_005b2bcf;
                  local_a8 = *(vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> **)
                              (paVar11 + uVar56);
                  uStack_a0 = 0;
                  local_d0 = (Model *)CONCAT44(local_d0._4_4_,paVar11[uVar56].z);
                  local_68 = *(string **)(paVar48 + uVar56);
                  pSStack_60 = (Skin *)0x0;
                  local_78[0] = paVar48[uVar56].z;
                  local_98._0_8_ = local_98._0_8_ & 0xffffffff00000000;
                  puVar44 = MeshGeometry::ToOutputVertexIndex
                                      (mesh,(uint)(&paVar46->x)[uVar56],
                                       (uint *)__return_storage_ptr__);
                  if (local_98._0_4_ != 0) {
                    uVar47 = 0;
                    do {
                      uVar28 = puVar44[uVar47];
                      paVar31 = local_e0->mVertices;
                      uVar3 = paVar31[uVar28].x;
                      uVar8 = paVar31[uVar28].y;
                      paVar31[uVar28].x = (float)uVar3 + (float)local_a8;
                      paVar31[uVar28].y = (float)uVar8 + local_a8._4_4_;
                      paVar31[uVar28].z = paVar31[uVar28].z + local_d0._0_4_;
                      paVar31 = local_e0->mNormals;
                      if (paVar31 != (aiVector3D *)0x0) {
                        uVar4 = paVar31[uVar28].x;
                        uVar9 = paVar31[uVar28].y;
                        paVar31[uVar28].x = (float)uVar4 + (float)local_68;
                        paVar31[uVar28].y = (float)uVar9 + local_68._4_4_;
                        paVar31[uVar28].z = paVar31[uVar28].z + local_78[0];
                        paVar31 = local_e0->mNormals;
                        uVar5 = paVar31[uVar28].x;
                        uVar10 = paVar31[uVar28].y;
                        fVar57 = paVar31[uVar28].z;
                        fVar58 = SQRT(fVar57 * fVar57 +
                                      (float)uVar5 * (float)uVar5 + (float)uVar10 * (float)uVar10);
                        if (0.0 < fVar58) {
                          paVar31 = paVar31 + uVar28;
                          fVar58 = 1.0 / fVar58;
                          paVar31->x = (float)uVar5 * fVar58;
                          paVar31->y = (float)uVar10 * fVar58;
                          paVar31->z = fVar57 * fVar58;
                        }
                      }
                      uVar47 = uVar47 + 1;
                    } while (uVar47 < (local_98._0_8_ & 0xffffffff));
                  }
                  uVar56 = uVar56 + 1;
                  paVar46 = (pvVar35->
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                } while (uVar56 < (ulong)((long)(pvVar35->
                                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                          (long)paVar46 >> 2));
              }
              piVar50 = local_38;
              fVar57 = 1.0;
              if (8 < (ulong)((long)(local_d8->shapeGeometries).
                                    super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_d8->shapeGeometries).
                                   super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start)) {
                fVar57 = local_d8->percent / 100.0;
              }
              local_e0->mWeight = fVar57;
              iVar51._M_current = iStack_c0._M_current;
              if (iStack_c0._M_current == local_b8) {
                std::vector<aiAnimMesh*,std::allocator<aiAnimMesh*>>::
                _M_realloc_insert<aiAnimMesh*const&>
                          ((vector<aiAnimMesh*,std::allocator<aiAnimMesh*>> *)&local_c8,iStack_c0,
                           &local_e0);
              }
              else {
                *iStack_c0._M_current = local_e0;
                iStack_c0._M_current = iStack_c0._M_current + 1;
              }
              piVar50 = (pointer)((long)piVar50 + 1);
            } while (piVar50 < (pointer)((long)(local_d8->shapeGeometries).
                                               super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(local_d8->shapeGeometries).
                                               super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          ppBVar42 = local_40 + 1;
        } while (ppBVar42 != local_48);
      }
      ppBVar41 = local_50 + 1;
    } while (ppBVar41 != local_58);
  }
  uVar27 = local_78._8_8_;
  if ((long)iStack_c0._M_current - (long)local_c8 != 0) {
    uVar56 = (long)iStack_c0._M_current - (long)local_c8 >> 3;
    out->mNumAnimMeshes = (uint)uVar56;
    ppaVar45 = (aiAnimMesh **)
               operator_new__(-(ulong)(uVar56 >> 0x3d != 0) |
                              (long)iStack_c0._M_current - (long)local_c8);
    out->mAnimMeshes = ppaVar45;
    uVar47 = 0;
    do {
      if ((ulong)((long)iStack_c0._M_current - (long)local_c8 >> 3) <= uVar47) goto LAB_005b2bf9;
      out->mAnimMeshes[uVar47] = *(aiAnimMesh **)((long)local_c8 + uVar47 * 8);
      uVar47 = uVar47 + 1;
    } while (uVar56 + (uVar56 == 0) != uVar47);
  }
  ppaVar19 = (((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)(uVar27 + 8))->
             super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppaVar20 = *(pointer *)(uVar27 + 0x10);
  if (local_c8 != (void *)0x0) {
    operator_delete(local_c8,(long)local_b8 - (long)local_c8);
  }
  return (int)((ulong)((long)ppaVar20 - (long)ppaVar19) >> 3) - 1;
LAB_005b2bf9:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_005b2c07:
  __assert_fail("normals.size() == vertices.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                ,0x444,
                "unsigned int Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode &)"
               );
}

Assistant:

unsigned int FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry& mesh, const Model& model,
            const aiMatrix4x4& node_global_transform, aiNode& nd)
        {
            const MatIndexArray& mindices = mesh.GetMaterialIndices();
            aiMesh* const out_mesh = SetupEmptyMesh(mesh, nd);

            const std::vector<aiVector3D>& vertices = mesh.GetVertices();
            const std::vector<unsigned int>& faces = mesh.GetFaceIndexCounts();

            // copy vertices
            out_mesh->mNumVertices = static_cast<unsigned int>(vertices.size());
            out_mesh->mVertices = new aiVector3D[vertices.size()];

            std::copy(vertices.begin(), vertices.end(), out_mesh->mVertices);

            // generate dummy faces
            out_mesh->mNumFaces = static_cast<unsigned int>(faces.size());
            aiFace* fac = out_mesh->mFaces = new aiFace[faces.size()]();

            unsigned int cursor = 0;
            for (unsigned int pcount : faces) {
                aiFace& f = *fac++;
                f.mNumIndices = pcount;
                f.mIndices = new unsigned int[pcount];
                switch (pcount)
                {
                case 1:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                    break;
                }
                for (unsigned int i = 0; i < pcount; ++i) {
                    f.mIndices[i] = cursor++;
                }
            }

            // copy normals
            const std::vector<aiVector3D>& normals = mesh.GetNormals();
            if (normals.size()) {
                ai_assert(normals.size() == vertices.size());

                out_mesh->mNormals = new aiVector3D[vertices.size()];
                std::copy(normals.begin(), normals.end(), out_mesh->mNormals);
            }

            // copy tangents - assimp requires both tangents and bitangents (binormals)
            // to be present, or neither of them. Compute binormals from normals
            // and tangents if needed.
            const std::vector<aiVector3D>& tangents = mesh.GetTangents();
            const std::vector<aiVector3D>* binormals = &mesh.GetBinormals();

            if (tangents.size()) {
                std::vector<aiVector3D> tempBinormals;
                if (!binormals->size()) {
                    if (normals.size()) {
                        tempBinormals.resize(normals.size());
                        for (unsigned int i = 0; i < tangents.size(); ++i) {
                            tempBinormals[i] = normals[i] ^ tangents[i];
                        }

                        binormals = &tempBinormals;
                    }
                    else {
                        binormals = NULL;
                    }
                }

                if (binormals) {
                    ai_assert(tangents.size() == vertices.size());
                    ai_assert(binormals->size() == vertices.size());

                    out_mesh->mTangents = new aiVector3D[vertices.size()];
                    std::copy(tangents.begin(), tangents.end(), out_mesh->mTangents);

                    out_mesh->mBitangents = new aiVector3D[vertices.size()];
                    std::copy(binormals->begin(), binormals->end(), out_mesh->mBitangents);
                }
            }

            // copy texture coords
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                const std::vector<aiVector2D>& uvs = mesh.GetTextureCoords(i);
                if (uvs.empty()) {
                    break;
                }

                aiVector3D* out_uv = out_mesh->mTextureCoords[i] = new aiVector3D[vertices.size()];
                for (const aiVector2D& v : uvs) {
                    *out_uv++ = aiVector3D(v.x, v.y, 0.0f);
                }

                out_mesh->mNumUVComponents[i] = 2;
            }

            // copy vertex colors
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i) {
                const std::vector<aiColor4D>& colors = mesh.GetVertexColors(i);
                if (colors.empty()) {
                    break;
                }

                out_mesh->mColors[i] = new aiColor4D[vertices.size()];
                std::copy(colors.begin(), colors.end(), out_mesh->mColors[i]);
            }

            if (!doc.Settings().readMaterials || mindices.empty()) {
                FBXImporter::LogError("no material assigned to mesh, setting default material");
                out_mesh->mMaterialIndex = GetDefaultMaterial();
            }
            else {
                ConvertMaterialForMesh(out_mesh, model, mesh, mindices[0]);
            }

            if (doc.Settings().readWeights && mesh.DeformerSkin() != NULL) {
                ConvertWeights(out_mesh, model, mesh, node_global_transform, NO_MATERIAL_SEPARATION);
            }

            std::vector<aiAnimMesh*> animMeshes;
            for (const BlendShape* blendShape : mesh.GetBlendShapes()) {
                for (const BlendShapeChannel* blendShapeChannel : blendShape->BlendShapeChannels()) {
                    const std::vector<const ShapeGeometry*>& shapeGeometries = blendShapeChannel->GetShapeGeometries();
                    for (size_t i = 0; i < shapeGeometries.size(); i++) {
                        aiAnimMesh *animMesh = aiCreateAnimMesh(out_mesh);
                        const ShapeGeometry* shapeGeometry = shapeGeometries.at(i);
                        const std::vector<aiVector3D>& vertices = shapeGeometry->GetVertices();
                        const std::vector<aiVector3D>& normals = shapeGeometry->GetNormals();
                        const std::vector<unsigned int>& indices = shapeGeometry->GetIndices();
                        animMesh->mName.Set(FixAnimMeshName(shapeGeometry->Name()));
                        for (size_t j = 0; j < indices.size(); j++) {
                            unsigned int index = indices.at(j);
                            aiVector3D vertex = vertices.at(j);
                            aiVector3D normal = normals.at(j);
                            unsigned int count = 0;
                            const unsigned int* outIndices = mesh.ToOutputVertexIndex(index, count);
                            for (unsigned int k = 0; k < count; k++) {
                                unsigned int index = outIndices[k];
                                animMesh->mVertices[index] += vertex;
                                if (animMesh->mNormals != nullptr) {
                                    animMesh->mNormals[index] += normal;
                                    animMesh->mNormals[index].NormalizeSafe();
                                }
                            }
                        }
                        animMesh->mWeight = shapeGeometries.size() > 1 ? blendShapeChannel->DeformPercent() / 100.0f : 1.0f;
                        animMeshes.push_back(animMesh);
                    }
                }
            }
            const size_t numAnimMeshes = animMeshes.size();
            if (numAnimMeshes > 0) {
                out_mesh->mNumAnimMeshes = static_cast<unsigned int>(numAnimMeshes);
                out_mesh->mAnimMeshes = new aiAnimMesh*[numAnimMeshes];
                for (size_t i = 0; i < numAnimMeshes; i++) {
                    out_mesh->mAnimMeshes[i] = animMeshes.at(i);
                }
            }
            return static_cast<unsigned int>(meshes.size() - 1);
        }